

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_parse_to_node(REF_GRID ref_grid,int argc,char **argv)

{
  REF_NODE ref_node_00;
  REF_DBL *metric_00;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *metric;
  REF_NODE ref_node;
  char **argv_local;
  int argc_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xd94,
           "ref_metric_parse_to_node","malloc metric of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    metric_00 = (REF_DBL *)malloc((long)(ref_node_00->max * 6) << 3);
    if (metric_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xd94,"ref_metric_parse_to_node","malloc metric of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      ref_grid_local._4_4_ = ref_metric_from_node(metric_00,ref_node_00);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_metric_parse(metric_00,ref_grid,argc,argv);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_metric_to_node(metric_00,ref_node_00);
          if (ref_grid_local._4_4_ == 0) {
            if (metric_00 != (REF_DBL *)0x0) {
              free(metric_00);
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xd97,"ref_metric_parse_to_node",(ulong)ref_grid_local._4_4_,"to");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xd96,"ref_metric_parse_to_node",(ulong)ref_grid_local._4_4_,"parse uniform");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xd95,"ref_metric_parse_to_node",(ulong)ref_grid_local._4_4_,"from");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_parse_to_node(REF_GRID ref_grid, int argc,
                                            char *argv[]) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *metric;
  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_node(metric, ref_node), "from");
  RSS(ref_metric_parse(metric, ref_grid, argc, argv), "parse uniform");
  RSS(ref_metric_to_node(metric, ref_node), "to");
  ref_free(metric);
  return REF_SUCCESS;
}